

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O2

void __thiscall
wasm::
SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
::insert(SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
         *this,uint *x)

{
  InsertResult IVar1;
  
  if ((this->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&this->flexible,x);
    return;
  }
  IVar1 = OrderedFixedStorage<unsigned_int,_3UL>::insert(&this->fixed,x);
  if (IVar1 == CouldNotInsert) {
    if ((this->fixed).super_FixedStorageBase<unsigned_int,_3UL>.used != 3) {
      __assert_fail("fixed.used == N",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                    ,0xa7,
                    "void wasm::SmallSetBase<unsigned int, 3, wasm::OrderedFixedStorage<unsigned int, 3>, std::set<unsigned int>>::insert(const T &) [T = unsigned int, N = 3, FixedStorage = wasm::OrderedFixedStorage<unsigned int, 3>, FlexibleSet = std::set<unsigned int>]"
                   );
    }
    if ((this->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      __assert_fail("flexible.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                    ,0xa8,
                    "void wasm::SmallSetBase<unsigned int, 3, wasm::OrderedFixedStorage<unsigned int, 3>, std::set<unsigned int>>::insert(const T &) [T = unsigned int, N = 3, FixedStorage = wasm::OrderedFixedStorage<unsigned int, 3>, FlexibleSet = std::set<unsigned int>]"
                   );
    }
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_range_unique<unsigned_int*>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&this->flexible,
               (this->fixed).super_FixedStorageBase<unsigned_int,_3UL>.storage._M_elems,
               (uint *)&(this->fixed).super_FixedStorageBase<unsigned_int,_3UL>.field_0x14);
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&this->flexible,x);
    if ((this->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      __assert_fail("!usingFixed()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                    ,0xac,
                    "void wasm::SmallSetBase<unsigned int, 3, wasm::OrderedFixedStorage<unsigned int, 3>, std::set<unsigned int>>::insert(const T &) [T = unsigned int, N = 3, FixedStorage = wasm::OrderedFixedStorage<unsigned int, 3>, FlexibleSet = std::set<unsigned int>]"
                   );
    }
    (this->fixed).super_FixedStorageBase<unsigned_int,_3UL>.used = 0;
  }
  return;
}

Assistant:

void insert(const T& x) {
    if (usingFixed()) {
      if (fixed.insert(x) == FixedStorage::InsertResult::CouldNotInsert) {
        // We need to add an item but no fixed storage remains to grow. Switch
        // to flexible.
        assert(fixed.used == N);
        assert(flexible.empty());
        flexible.insert(fixed.storage.begin(),
                        fixed.storage.begin() + fixed.used);
        flexible.insert(x);
        assert(!usingFixed());
        fixed.used = 0;
      }
    } else {
      flexible.insert(x);
    }
  }